

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void internal_counters_gga_random
               (xc_dimensions *dim,int pos,int offset,double **rho,double **sigma,double **zk,
               double **vrho,double **vsigma,double **v2rho2,double **v2rhosigma,double **v2sigma2,
               double **v3rho3,double **v3rho2sigma,double **v3rhosigma2,double **v3sigma3,
               double **v4rho4,double **v4rho3sigma,double **v4rho2sigma2,double **v4rhosigma3,
               double **v4sigma4)

{
  double **in_RCX;
  int in_EDX;
  int in_ESI;
  xc_dimensions *in_RDI;
  long *in_R8;
  double **in_R9;
  double **in_stack_00000008;
  long *in_stack_00000010;
  double **in_stack_00000018;
  
  internal_counters_lda_random
            (in_RDI,in_ESI,in_EDX,in_RCX,in_R9,in_stack_00000008,in_stack_00000018,rho,vrho);
  if (*in_R8 != 0) {
    *in_R8 = *in_R8 + (long)(in_ESI * in_RDI->sigma + in_EDX) * 8;
  }
  if (*in_stack_00000008 != (double *)0x0) {
    *in_stack_00000010 = *in_stack_00000010 + (long)(in_ESI * in_RDI->vsigma + in_EDX) * 8;
  }
  if (*in_stack_00000018 != (double *)0x0) {
    *zk = *zk + (in_ESI * in_RDI->v2rhosigma + in_EDX);
    *sigma = *sigma + (in_ESI * in_RDI->v2sigma2 + in_EDX);
  }
  return;
}

Assistant:

GPU_FUNCTION void
internal_counters_gga_random
  (
   const xc_dimensions *dim, int pos, int offset, const double **rho, const double **sigma,
   double **zk GGA_OUT_PARAMS_NO_EXC(XC_COMMA double **, ))
{
  internal_counters_lda_random(dim, pos, offset, rho, zk LDA_OUT_PARAMS_NO_EXC(XC_COMMA, ));

  if(*sigma != NULL) *sigma += pos*dim->sigma  + offset;
#ifndef XC_DONT_COMPILE_VXC
  if(*vrho != NULL) *vsigma += pos*dim->vsigma + offset;
#ifndef XC_DONT_COMPILE_FXC
  if(*v2rho2 != NULL) {
    *v2rhosigma += pos*dim->v2rhosigma + offset;
    *v2sigma2   += pos*dim->v2sigma2  + offset;
  }
#ifndef XC_DONT_COMPILE_KXC
  if(*v3rho3 != NULL) {
    *v3rho2sigma += pos*dim->v3rho2sigma + offset;
    *v3rhosigma2 += pos*dim->v3rhosigma2 + offset;
    *v3sigma3    += pos*dim->v3sigma3    + offset;
  }
#ifndef XC_DONT_COMPILE_LXC
  if(*v4rho4 != NULL) {
    *v4rho3sigma  += pos*dim->v4rho3sigma  + offset;
    *v4rho2sigma2 += pos*dim->v4rho2sigma2 + offset;
    *v4rhosigma3  += pos*dim->v4rhosigma3  + offset;
    *v4sigma4     += pos*dim->v4sigma4     + offset;
  }
#endif
#endif
#endif
#endif
}